

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O1

void water_friction(schar *udx,schar *udy)

{
  char cVar1;
  xchar xVar2;
  boolean bVar3;
  uint uVar4;
  schar *psVar5;
  int iVar6;
  int x;
  schar sVar7;
  int iVar8;
  
  if ((((u.uprops[0x39].extrinsic != 0 || u.uprops[0x39].intrinsic != 0) ||
       (((youmonst.data)->mflags1 & 2) != 0)) ||
      ((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 2) != 0)))) &&
     (uVar4 = mt_random(), (uVar4 & 3) != 0)) {
    return;
  }
  if ((*udx == '\0') ||
     (cVar1 = *udy, uVar4 = mt_random(), xVar2 = u.ux, uVar4 % ((uint)(cVar1 != '\0') * 3 + 3) != 0)
     ) {
    if ((*udy == '\0') ||
       (cVar1 = *udx, uVar4 = mt_random(), xVar2 = u.uy,
       uVar4 % ((uint)(cVar1 != '\0') * 2 + 3) != 0)) {
      return;
    }
    iVar6 = (int)u.uy;
    uVar4 = mt_random();
    iVar8 = ~((uVar4 / 3) * 3) + uVar4;
    if (iVar8 != 0) {
      x = u.ux + iVar8;
      do {
        if ((x - 1U < 0x4f && (byte)xVar2 < 0x15) && (bVar3 = is_pool(level,x,iVar6), bVar3 != '\0')
           ) break;
        uVar4 = mt_random();
        iVar8 = ~((uVar4 / 3) * 3) + uVar4;
        x = u.ux + iVar8;
      } while (iVar8 != 0);
    }
    sVar7 = (schar)iVar8;
    psVar5 = udy;
  }
  else {
    iVar8 = (int)u.ux;
    uVar4 = mt_random();
    iVar6 = ~((uVar4 / 3) * 3) + uVar4;
    if (iVar6 != 0) {
      uVar4 = u.uy + iVar6;
      do {
        if ((((byte)(xVar2 - 1U) < 0x4f) && (uVar4 < 0x15)) &&
           (bVar3 = is_pool(level,iVar8,uVar4), bVar3 != '\0')) break;
        uVar4 = mt_random();
        iVar6 = ~((uVar4 / 3) * 3) + uVar4;
        uVar4 = u.uy + iVar6;
      } while (iVar6 != 0);
    }
    sVar7 = (schar)iVar6;
    psVar5 = udx;
    udx = udy;
  }
  *psVar5 = '\0';
  *udx = sVar7;
  pline("Water turbulence affects your movements.");
  return;
}

Assistant:

void water_friction(schar *udx, schar *udy)
{
	int x, y, dx, dy;
	boolean eff = FALSE;

	if (Swimming && rn2(4))
		return;		/* natural swimmers have advantage */

	if (*udx && !rn2(!*udy ? 3 : 6)) {	/* 1/3 chance or half that */
		/* cancel delta x and choose an arbitrary delta y value */
		x = u.ux;
		do {
		    dy = rn2(3) - 1;		/* -1, 0, 1 */
		    y = u.uy + dy;
		} while (dy && (!isok(x,y) || !is_pool(level, x,y)));
		*udx = 0;
		*udy = dy;
		eff = TRUE;
	} else if (*udy && !rn2(!*udx ? 3 : 5)) {	/* 1/3 or 1/5*(5/6) */
		/* cancel delta y and choose an arbitrary delta x value */
		y = u.uy;
		do {
		    dx = rn2(3) - 1;		/* -1 .. 1 */
		    x = u.ux + dx;
		} while (dx && (!isok(x,y) || !is_pool(level, x,y)));
		*udy = 0;
		*udx = dx;
		eff = TRUE;
	}
	if (eff) pline("Water turbulence affects your movements.");
}